

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanTypeConversions.cpp
# Opt level: O0

VkCopyAccelerationStructureModeKHR
Diligent::CopyASModeToVkCopyAccelerationStructureMode(COPY_AS_MODE Mode)

{
  Char *Message;
  undefined1 local_30 [8];
  string msg;
  COPY_AS_MODE Mode_local;
  
  if (Mode == COPY_AS_MODE_CLONE) {
    msg.field_2._12_4_ = 0;
  }
  else if (Mode == COPY_AS_MODE_COMPACT) {
    msg.field_2._12_4_ = 1;
  }
  else {
    msg.field_2._M_local_buf[0xb] = Mode;
    FormatString<char[21]>((string *)local_30,(char (*) [21])"unknown AS copy mode");
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"CopyASModeToVkCopyAccelerationStructureMode",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanTypeConversions.cpp"
               ,0x719);
    std::__cxx11::string::~string((string *)local_30);
    msg.field_2._12_4_ = 0x7fffffff;
  }
  return msg.field_2._12_4_;
}

Assistant:

VkCopyAccelerationStructureModeKHR CopyASModeToVkCopyAccelerationStructureMode(COPY_AS_MODE Mode)
{
    static_assert(COPY_AS_MODE_LAST == COPY_AS_MODE_COMPACT,
                  "Please update the switch below to handle the new copy AS mode");

    switch (Mode)
    {
        // clang-format off
        case COPY_AS_MODE_CLONE:   return VK_COPY_ACCELERATION_STRUCTURE_MODE_CLONE_KHR;
        case COPY_AS_MODE_COMPACT: return VK_COPY_ACCELERATION_STRUCTURE_MODE_COMPACT_KHR;
        // clang-format on
        default:
            UNEXPECTED("unknown AS copy mode");
            return VK_COPY_ACCELERATION_STRUCTURE_MODE_MAX_ENUM_KHR;
    }
}